

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromHorizontalCross<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  undefined1 auVar1 [16];
  CubemapFace<unsigned_char> *pCVar2;
  uchar *puVar3;
  CubemapFace<unsigned_char> **ppCVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _height;
  iVar5 = (int)(_width >> 2);
  lVar6 = (long)iVar5 * _channels;
  iVar11 = SUB164(auVar1 / ZEXT816(3),0);
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    pCVar2 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar2->data = (uchar *)0x0;
    pCVar2->id = 0;
    pCVar2->width = 0;
    pCVar2->height = 0;
    pCVar2->currentOffset = 0;
    _faces[lVar9] = pCVar2;
    pCVar2->id = (int)lVar9;
    puVar3 = (uchar *)operator_new__(iVar11 * lVar6);
    pCVar2->data = puVar3;
    pCVar2->width = iVar5;
    pCVar2->height = iVar11;
    pCVar2->currentOffset = 0;
  }
  iVar5 = (int)lVar6;
  for (uVar8 = 0; uVar8 != _height; uVar8 = uVar8 + 1) {
    uVar10 = 0;
    lVar6 = 2;
    while (lVar6 != -2) {
      iVar7 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                   (long)iVar11);
      ppCVar4 = _faces;
      if (((((iVar7 == 1 && lVar6 == 0) || (ppCVar4 = _faces + 1, iVar7 == 1 && lVar6 == 2)) ||
           (ppCVar4 = _faces + 2, iVar7 == 0 && lVar6 == 1)) ||
          (((ppCVar4 = _faces + 3, iVar7 == 2 && lVar6 == 1 ||
            (ppCVar4 = _faces + 4, iVar7 == 1 && lVar6 == 1)) ||
           (ppCVar4 = _faces + 5, lVar6 == -1 && iVar7 == 1)))) &&
         (pCVar2 = *ppCVar4, pCVar2 != (CubemapFace<unsigned_char> *)0x0)) {
        memcpy(pCVar2->data + pCVar2->currentOffset,
               _data + ((long)(((uVar10 & 0xffffffff) + uVar8 * _width) * (_channels << 0x20)) >>
                       0x20),(long)iVar5);
        pCVar2->currentOffset = pCVar2->currentOffset + iVar5;
      }
      uVar10 = uVar10 + (_width >> 2);
      lVar6 = lVar6 + -1;
    }
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}